

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *ppDVar1;
  slot_type *ppDVar2;
  slot_type *ppDVar3;
  slot_type *ppDVar4;
  slot_type *ppDVar5;
  bool bVar6;
  slot_type *ppDVar7;
  
  ppDVar1 = (slot_type *)a->ctrl_;
  if ((ppDVar1 == (slot_type *)(kEmptyGroup + 0x10) || ppDVar1 == (slot_type *)0x0) ||
     (kSentinel < *(ctrl_t *)ppDVar1)) {
    ppDVar2 = (slot_type *)b->ctrl_;
    if ((ppDVar2 != (slot_type *)(kEmptyGroup + 0x10) && ppDVar2 != (slot_type *)0x0) &&
       (*(ctrl_t *)ppDVar2 < ~kSentinel)) goto LAB_00f384d7;
    if (ppDVar1 == (slot_type *)(kEmptyGroup + 0x10) && ppDVar2 == (slot_type *)(kEmptyGroup + 0x10)
       ) {
LAB_00f384ca:
      return ppDVar1 == ppDVar2;
    }
    if ((ppDVar1 == (slot_type *)(kEmptyGroup + 0x10)) ==
        (ppDVar2 == (slot_type *)(kEmptyGroup + 0x10))) {
      if (ppDVar1 == (slot_type *)0x0 || ppDVar2 == (slot_type *)0x0) goto LAB_00f384ca;
      if ((ppDVar2 == (slot_type *)kSooControl) == (ppDVar1 == (slot_type *)kSooControl)) {
        ppDVar3 = (a->field_1).slot_;
        ppDVar4 = (b->field_1).slot_;
        if (ppDVar1 == (slot_type *)kSooControl) {
          bVar6 = ppDVar3 == ppDVar4;
        }
        else {
          ppDVar7 = ppDVar4;
          ppDVar5 = ppDVar2;
          if (ppDVar2 < ppDVar1) {
            ppDVar7 = ppDVar3;
            ppDVar5 = ppDVar1;
            ppDVar3 = ppDVar4;
          }
          bVar6 = ppDVar3 <= ppDVar7 && ppDVar5 < ppDVar3;
        }
        if (bVar6) goto LAB_00f384ca;
      }
      goto LAB_00f384e1;
    }
  }
  else {
    operator==();
LAB_00f384d7:
    operator==();
  }
  operator==();
LAB_00f384e1:
  operator==();
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }